

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::UTF8InSourceTest::prepareNextTestCase
          (UTF8InSourceTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  UTF8_CHARACTERS UVar1;
  GLchar *__s;
  size_t sVar2;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if (test_case_index == 0xffffffff) {
    UVar1 = EMPTY;
  }
  else {
    if (5 < test_case_index) {
      return false;
    }
    UVar1 = prepareNextTestCase::test_cases[test_case_index];
  }
  this->m_character = UVar1;
  local_190._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Test case: utf8 character: ",0x1b);
  __s = Utils::getUtf8Character(this->m_character);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

bool UTF8InSourceTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	static const Utils::UTF8_CHARACTERS test_cases[] = {
		Utils::TWO_BYTES,  Utils::THREE_BYTES, Utils::FOUR_BYTES,
		Utils::FIVE_BYTES, Utils::SIX_BYTES,   Utils::REDUNDANT_ASCII
	};

	static const GLuint max_test_cases = sizeof(test_cases) / sizeof(Utils::UTF8_CHARACTERS);

	if ((GLuint)-1 == test_case_index)
	{
		m_character = Utils::EMPTY;
	}
	else if (max_test_cases <= test_case_index)
	{
		return false;
	}
	else
	{
		m_character = test_cases[test_case_index];
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "Test case: utf8 character: " << Utils::getUtf8Character(m_character)
										<< tcu::TestLog::EndMessage;

	return true;
}